

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChargeZ.cpp
# Opt level: O0

void __thiscall OpenMD::ChargeZ::process(ChargeZ *this)

{
  double dVar1;
  uint uVar2;
  double dVar3;
  bool bVar4;
  bool bVar5;
  SnapshotManager *this_00;
  Snapshot *pSVar6;
  double *pdVar7;
  reference pvVar8;
  ulong uVar9;
  reference pvVar10;
  size_type sVar11;
  reference ppSVar12;
  long *in_RDI;
  RealType RVar13;
  FluctuatingChargeAdapter fqa;
  FixedChargeAdapter fca;
  AtomType *atomType;
  Atom *atom;
  RealType q;
  uint k;
  RealType binC;
  uint i_1;
  int binNo;
  Vector3d pos_1;
  Vector3d pos;
  RealType area;
  RealType halfBoxZ_;
  Mat3x3d hmat;
  uint i;
  int istep;
  int nFrames;
  DumpReader reader;
  bool usePeriodicBoundaryConditions_;
  int ii;
  StuntDouble *sd;
  Snapshot *in_stack_ffffffffffffeb98;
  DumpReader *in_stack_ffffffffffffeba0;
  StuntDouble *in_stack_ffffffffffffeba8;
  undefined7 in_stack_ffffffffffffebb0;
  undefined1 in_stack_ffffffffffffebb7;
  SelectionEvaluator *in_stack_ffffffffffffebd8;
  Snapshot *in_stack_ffffffffffffec10;
  Snapshot *in_stack_ffffffffffffec20;
  int in_stack_ffffffffffffec2c;
  DumpReader *in_stack_ffffffffffffec30;
  FluctuatingChargeAdapter local_1370;
  FixedChargeAdapter local_1368;
  AtomType *local_1360;
  Atom *local_1358;
  double local_1350;
  uint local_1344;
  DumpReader *local_1340;
  uint local_1338;
  int local_1334;
  Vector<double,_3U> local_1330 [3];
  DumpReader *local_12e8;
  double local_12e0;
  RectMatrix<double,_3U,_3U> local_12d8;
  uint local_128c;
  int local_1288;
  int local_1274;
  string *in_stack_ffffffffffffedf0;
  SimInfo *in_stack_ffffffffffffedf8;
  DumpReader *in_stack_ffffffffffffee00;
  Snapshot *local_10;
  
  SimInfo::getSimParams((SimInfo *)in_RDI[1]);
  bVar4 = Globals::getUsePeriodicBoundaryConditions((Globals *)0x1fe180);
  DumpReader::DumpReader
            (in_stack_ffffffffffffee00,in_stack_ffffffffffffedf8,in_stack_ffffffffffffedf0);
  local_1274 = DumpReader::getNFrames(in_stack_ffffffffffffeba0);
  *(int *)(in_RDI + 0x1a) = local_1274 / (int)in_RDI[6];
  for (local_1288 = 0; local_1288 < local_1274; local_1288 = (int)in_RDI[6] + local_1288) {
    DumpReader::readFrame(in_stack_ffffffffffffec30,in_stack_ffffffffffffec2c);
    this_00 = SimInfo::getSnapshotManager((SimInfo *)in_RDI[1]);
    pSVar6 = SnapshotManager::getCurrentSnapshot(this_00);
    in_RDI[0x19] = (long)pSVar6;
    for (local_128c = 0; local_128c < *(uint *)((long)in_RDI + 0x34); local_128c = local_128c + 1) {
      std::
      vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
      ::operator[]((vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                    *)(in_RDI + 0xe3),(ulong)local_128c);
      std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::clear
                ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)0x1fe2b5);
    }
    Snapshot::getHmat(in_stack_ffffffffffffeb98);
    RectMatrix<double,_3U,_3U>::operator()
              (&local_12d8,*(uint *)(in_RDI + 0xf2),*(uint *)(in_RDI + 0xf2));
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_ffffffffffffebb7,in_stack_ffffffffffffebb0),
               (value_type_conflict2 *)in_stack_ffffffffffffeba8);
    pdVar7 = RectMatrix<double,_3U,_3U>::operator()
                       (&local_12d8,*(uint *)(in_RDI + 0xf2),*(uint *)(in_RDI + 0xf2));
    local_12e0 = *pdVar7 * 0.5;
    local_12e8 = (DumpReader *)0x0;
    if ((int)in_RDI[0xf2] == 0) {
      local_12e8 = (DumpReader *)Snapshot::getYZarea(in_stack_ffffffffffffec10);
    }
    else if ((int)in_RDI[0xf2] == 1) {
      local_12e8 = (DumpReader *)Snapshot::getXZarea(in_stack_ffffffffffffec10);
    }
    else {
      in_stack_ffffffffffffec30 = (DumpReader *)Snapshot::getXYarea(in_stack_ffffffffffffec10);
      local_12e8 = in_stack_ffffffffffffec30;
    }
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_ffffffffffffebb7,in_stack_ffffffffffffebb0),
               (value_type_conflict2 *)in_stack_ffffffffffffeba8);
    bVar5 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x1f));
    in_stack_ffffffffffffec2c = CONCAT13(bVar5,(int3)in_stack_ffffffffffffec2c);
    if (bVar5) {
      in_stack_ffffffffffffec20 = (Snapshot *)(in_RDI + 0xc9);
      SelectionEvaluator::evaluate(in_stack_ffffffffffffebd8);
      SelectionManager::setSelectionSet
                ((SelectionManager *)CONCAT17(in_stack_ffffffffffffebb7,in_stack_ffffffffffffebb0),
                 (SelectionSet *)in_stack_ffffffffffffeba8);
      SelectionSet::~SelectionSet((SelectionSet *)0x1fe52e);
    }
    pSVar6 = (Snapshot *)
             SelectionManager::beginSelected
                       ((SelectionManager *)
                        CONCAT17(in_stack_ffffffffffffebb7,in_stack_ffffffffffffebb0),
                        (int *)in_stack_ffffffffffffeba8);
    local_10 = pSVar6;
    while (local_10 != (Snapshot *)0x0) {
      StuntDouble::getPos(in_stack_ffffffffffffeba8);
      if (bVar4) {
        Snapshot::wrapVector(in_stack_ffffffffffffec20,(Vector3d *)pSVar6);
      }
      StuntDouble::setPos((StuntDouble *)
                          CONCAT17(in_stack_ffffffffffffebb7,in_stack_ffffffffffffebb0),
                          (Vector3d *)in_stack_ffffffffffffeba8);
      in_stack_ffffffffffffec10 =
           (Snapshot *)
           SelectionManager::nextSelected
                     ((SelectionManager *)
                      CONCAT17(in_stack_ffffffffffffebb7,in_stack_ffffffffffffebb0),
                      (int *)in_stack_ffffffffffffeba8);
      local_10 = in_stack_ffffffffffffec10;
    }
    local_10 = (Snapshot *)
               SelectionManager::beginSelected
                         ((SelectionManager *)
                          CONCAT17(in_stack_ffffffffffffebb7,in_stack_ffffffffffffebb0),
                          (int *)in_stack_ffffffffffffeba8);
    while (local_10 != (Snapshot *)0x0) {
      StuntDouble::getPos(in_stack_ffffffffffffeba8);
      dVar3 = local_12e0;
      uVar2 = *(uint *)((long)in_RDI + 0x34);
      pdVar7 = Vector<double,_3U>::operator[](local_1330,*(uint *)(in_RDI + 0xf2));
      dVar1 = *pdVar7;
      pdVar7 = RectMatrix<double,_3U,_3U>::operator()
                         (&local_12d8,*(uint *)(in_RDI + 0xf2),*(uint *)(in_RDI + 0xf2));
      local_1334 = (int)(((double)uVar2 * (dVar3 + dVar1)) / *pdVar7);
      std::
      vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
      ::operator[]((vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                    *)(in_RDI + 0xe3),(long)local_1334);
      std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::push_back
                ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
                 CONCAT17(in_stack_ffffffffffffebb7,in_stack_ffffffffffffebb0),
                 (value_type *)in_stack_ffffffffffffeba8);
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe6),
                          (long)local_1334);
      *pvVar8 = *pvVar8 + 1.0;
      in_stack_ffffffffffffebd8 =
           (SelectionEvaluator *)
           SelectionManager::nextSelected
                     ((SelectionManager *)
                      CONCAT17(in_stack_ffffffffffffebb7,in_stack_ffffffffffffebb0),
                      (int *)in_stack_ffffffffffffeba8);
      local_10 = (Snapshot *)in_stack_ffffffffffffebd8;
    }
    for (local_1338 = 0; local_1338 < *(uint *)((long)in_RDI + 0x34); local_1338 = local_1338 + 1) {
      local_1340 = (DumpReader *)0x0;
      local_1344 = 0;
      while( true ) {
        uVar9 = (ulong)local_1344;
        pvVar10 = std::
                  vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                  ::operator[]((vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                                *)(in_RDI + 0xe3),(ulong)local_1338);
        sVar11 = std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::size
                           (pvVar10);
        if (sVar11 <= uVar9) break;
        local_1350 = 0.0;
        pvVar10 = std::
                  vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                  ::operator[]((vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                                *)(in_RDI + 0xe3),(ulong)local_1338);
        ppSVar12 = std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::
                   operator[](pvVar10,(ulong)local_1344);
        local_1358 = (Atom *)*ppSVar12;
        local_1360 = Atom::getAtomType(local_1358);
        pvVar10 = std::
                  vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                  ::operator[]((vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                                *)(in_RDI + 0xe3),(ulong)local_1338);
        ppSVar12 = std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::
                   operator[](pvVar10,(ulong)local_1344);
        bVar5 = StuntDouble::isAtom(*ppSVar12);
        if (bVar5) {
          FixedChargeAdapter::FixedChargeAdapter(&local_1368,local_1360);
          bVar5 = FixedChargeAdapter::isFixedCharge((FixedChargeAdapter *)0x1fe902);
          if (bVar5) {
            RVar13 = FixedChargeAdapter::getCharge((FixedChargeAdapter *)in_stack_ffffffffffffeba0);
            local_1350 = RVar13 + local_1350;
          }
          FluctuatingChargeAdapter::FluctuatingChargeAdapter(&local_1370,local_1360);
          in_stack_ffffffffffffebb7 =
               FluctuatingChargeAdapter::isFluctuatingCharge((FluctuatingChargeAdapter *)0x1fe963);
          if ((bool)in_stack_ffffffffffffebb7) {
            in_stack_ffffffffffffeba8 =
                 (StuntDouble *)StuntDouble::getFlucQPos((StuntDouble *)in_stack_ffffffffffffeba0);
            local_1350 = (double)in_stack_ffffffffffffeba8 + local_1350;
          }
        }
        local_1340 = (DumpReader *)(local_1350 + (double)local_1340);
        local_1344 = local_1344 + 1;
      }
      in_stack_ffffffffffffeba0 = local_1340;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xef),
                          (ulong)local_1338);
      *pvVar8 = (double)in_stack_ffffffffffffeba0 + *pvVar8;
    }
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1fea30);
  }
  (**(code **)(*in_RDI + 0x20))();
  DumpReader::~DumpReader(in_stack_ffffffffffffeba0);
  return;
}

Assistant:

void ChargeZ::process() {
    StuntDouble* sd;
    int ii;

    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();
    nProcessed_ = nFrames / step_;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      for (unsigned int i = 0; i < nBins_; i++) {
        sliceSDLists_[i].clear();
      }

      Mat3x3d hmat = currentSnapshot_->getHmat();
      zBox_.push_back(hmat(axis_, axis_));

      RealType halfBoxZ_ = hmat(axis_, axis_) / 2.0;
      RealType area      = 0.0;
      switch (axis_) {
      case 0:
        area = currentSnapshot_->getYZarea();
        break;
      case 1:
        area = currentSnapshot_->getXZarea();
        break;
      case 2:
      default:
        area = currentSnapshot_->getXYarea();
        break;
      }

      areas_.push_back(area);

      if (evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }

      // wrap the stuntdoubles into a cell
      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        Vector3d pos = sd->getPos();
        if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(pos);
        sd->setPos(pos);
      }

      // determine which atom belongs to which slice
      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        Vector3d pos = sd->getPos();
        // shift molecules by half a box to have bins start at 0
        int binNo = int(nBins_ * (halfBoxZ_ + pos[axis_]) / hmat(axis_, axis_));
        sliceSDLists_[binNo].push_back(sd);
        sliceSDCount_[binNo]++;
      }

      // loop over the slices to calculate the charge
      for (unsigned int i = 0; i < nBins_; i++) {
        RealType binC = 0;
        for (unsigned int k = 0; k < sliceSDLists_[i].size(); ++k) {
          RealType q = 0.0;
          Atom* atom = static_cast<Atom*>(sliceSDLists_[i][k]);

          AtomType* atomType = atom->getAtomType();

          if (sliceSDLists_[i][k]->isAtom()) {
            FixedChargeAdapter fca = FixedChargeAdapter(atomType);
            if (fca.isFixedCharge()) { q += fca.getCharge(); }

            FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
            if (fqa.isFluctuatingCharge()) { q += atom->getFlucQPos(); }
          }

          binC += q;
        }
        chargeZ_[i] += binC;
        // Units of (e / Ang^2 / fs)
      }
    }

    writeChargeZ();
  }